

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::copy_R_and_t
          (Epnp *this,double (*R_src) [3],double *t_src,double (*R_dst) [3],double *t_dst)

{
  int j;
  int i;
  double *t_dst_local;
  double (*R_dst_local) [3];
  double *t_src_local;
  double (*R_src_local) [3];
  Epnp *this_local;
  
  for (i = 0; i < 3; i = i + 1) {
    for (j = 0; j < 3; j = j + 1) {
      R_dst[i][j] = R_src[i][j];
    }
    t_dst[i] = t_src[i];
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::copy_R_and_t(
    const double R_src[3][3],
    const double t_src[3],
    double R_dst[3][3],
    double t_dst[3])
{
  for(int i = 0; i < 3; i++)
  {
    for(int j = 0; j < 3; j++)
      R_dst[i][j] = R_src[i][j];
    t_dst[i] = t_src[i];
  }
}